

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O1

uint32_t helper_maddr_q(CPUTriCoreState *env,uint32_t r1,uint32_t r2,uint32_t r3,uint32_t n)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  lVar5 = 0x7fffffff;
  if (n != 1 || (r3 != 0xffff8000 || r2 != 0xffff8000)) {
    lVar5 = (long)(int)r3 * (long)(int)r2 << ((byte)n & 0x3f);
  }
  iVar3 = (int)lVar5 + r1;
  if (((int)r1 + lVar5) - 0x7fff8000U < 0xffffffff00000000) {
    env->PSW_USB_V = 0x80000000;
    pbVar1 = (byte *)((long)&env->PSW_USB_SV + 3);
    *pbVar1 = *pbVar1 | 0x80;
  }
  else {
    env->PSW_USB_V = 0;
  }
  uVar2 = iVar3 + 0x8000;
  uVar4 = iVar3 * 2 + 0x10000U ^ uVar2;
  env->PSW_USB_AV = uVar4;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar4;
  return uVar2 & 0xffff0000;
}

Assistant:

static inline int64_t sextract64(uint64_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 64 - start);
    /* Note that this implementation relies on right shift of signed
     * integers being an arithmetic shift.
     */
    return ((int64_t)(value << (64 - length - start))) >> (64 - length);
}